

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unicodeOpen(sqlite3_tokenizer *p,char *aInput,int nInput,sqlite3_tokenizer_cursor **pp)

{
  int iVar1;
  sqlite3_tokenizer_cursor *psVar2;
  size_t sVar3;
  
  psVar2 = (sqlite3_tokenizer_cursor *)sqlite3_malloc(0x30);
  if (psVar2 == (sqlite3_tokenizer_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    psVar2->pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar2[1].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar2[4].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar2[5].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar2[2].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar2[3].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar2[1].pTokenizer = (sqlite3_tokenizer *)aInput;
    if (aInput != (char *)0x0) {
      if (nInput < 0) {
        sVar3 = strlen(aInput);
        nInput = (int)sVar3;
      }
      *(int *)&psVar2[2].pTokenizer = nInput;
    }
    *pp = psVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int unicodeOpen(
  sqlite3_tokenizer *p,           /* The tokenizer */
  const char *aInput,             /* Input string */
  int nInput,                     /* Size of string aInput in bytes */
  sqlite3_tokenizer_cursor **pp   /* OUT: New cursor object */
){
  unicode_cursor *pCsr;

  pCsr = (unicode_cursor *)sqlite3_malloc(sizeof(unicode_cursor));
  if( pCsr==0 ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(unicode_cursor));

  pCsr->aInput = (const unsigned char *)aInput;
  if( aInput==0 ){
    pCsr->nInput = 0;
  }else if( nInput<0 ){
    pCsr->nInput = (int)strlen(aInput);
  }else{
    pCsr->nInput = nInput;
  }

  *pp = &pCsr->base;
  UNUSED_PARAMETER(p);
  return SQLITE_OK;
}